

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_track.cpp
# Opt level: O0

void __thiscall
cp::CoMTrack::setup(CoMTrack *this,double t,double single_sup_time,double double_sup_time,
                   double cog_h)

{
  double dVar1;
  double cog_h_local;
  double double_sup_time_local;
  double single_sup_time_local;
  double t_local;
  CoMTrack *this_local;
  
  *(double *)this = t;
  *(double *)(this + 8) = single_sup_time;
  *(double *)(this + 0x10) = double_sup_time;
  *(double *)(this + 0x20) = cog_h;
  *(double *)(this + 0x18) = single_sup_time + double_sup_time;
  dVar1 = sqrt(9.806 / *(double *)(this + 0x20));
  *(double *)(this + 0x28) = dVar1;
  return;
}

Assistant:

void CoMTrack::setup(double t, double single_sup_time,
                     double double_sup_time, double cog_h) {
  dt = t;
  sst = single_sup_time;
  dst = double_sup_time;
  cogh = cog_h;
  st = single_sup_time + double_sup_time;

  w = sqrt(9.806 / cogh);
}